

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O2

void __thiscall
testing::internal::linked_ptr_internal::join(linked_ptr_internal *this,linked_ptr_internal *ptr)

{
  linked_ptr_internal *plVar1;
  linked_ptr_internal *plVar2;
  MutexLock lock;
  
  lock.mutex_ = (MutexBase *)g_linked_ptr_mutex;
  MutexBase::Lock((MutexBase *)g_linked_ptr_mutex);
  plVar2 = ptr;
  do {
    plVar1 = plVar2->next_;
    if (plVar1 == ptr) {
      plVar2->next_ = this;
      this->next_ = ptr;
      GTestMutexLock::~GTestMutexLock(&lock);
      return;
    }
    plVar2 = plVar1;
  } while (plVar1 != this);
  __assert_fail("p->next_ != this && \"Trying to join() a linked ring we are already in. \" \"Is GMock thread safety enabled?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-linked_ptr.h"
                ,0x74,
                "void testing::internal::linked_ptr_internal::join(const linked_ptr_internal *)");
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    linked_ptr_internal const* p = ptr;
    while (p->next_ != ptr) {
      assert(p->next_ != this &&
             "Trying to join() a linked ring we are already in. "
             "Is GMock thread safety enabled?");
      p = p->next_;
    }
    p->next_ = this;
    next_ = ptr;
  }